

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall
ContextSpecificHolder<Integer,_(unsigned_char)'\x82',_(OptionType)0>::Decode
          (ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *this,uchar *pIn,
          size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  out_of_range *this_00;
  bool fRet;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *this_local;
  
  if (cbIn == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Insufficient buffer");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  bVar1 = IsPresent(this,*pIn);
  if (bVar1) {
    this_local._7_1_ = Integer::Decode(&this->innerType,pIn,cbIn,cbUsed);
    this->hasData = this_local._7_1_;
  }
  else {
    *cbUsed = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
    {
        // If this is an optional type, we could have used
        // all the bytes on the previous item
        if (cbIn == 0)
            throw std::out_of_range("Insufficient buffer");

        if (IsPresent(pIn[0]))
        {
            bool fRet = innerType.Decode(pIn, cbIn, cbUsed);
            hasData = fRet;
            return fRet;
        }

        cbUsed = 0;
        return false;
    }